

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
          (initializer_list<cnn::expr::Expression> *xs)

{
  const_iterator pEVar1;
  const_iterator pEVar2;
  reference this;
  int iVar3;
  undefined8 extraout_RDX;
  initializer_list<cnn::expr::Expression> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar4;
  const_iterator xi;
  int i;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> xis;
  ComputationGraph *pg;
  initializer_list<cnn::expr::Expression> *in_stack_ffffffffffffff70;
  ComputationGraph *i_00;
  ComputationGraph *in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffff80;
  ComputationGraph *this_00;
  const_iterator arguments;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> local_30;
  ComputationGraph *local_18;
  initializer_list<cnn::expr::Expression> *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  pEVar1 = std::initializer_list<cnn::expr::Expression>::begin(in_RSI);
  local_18 = pEVar1->pg;
  std::initializer_list<cnn::expr::Expression>::size(local_10);
  std::allocator<cnn::VariableIndex>::allocator((allocator<cnn::VariableIndex> *)0x4e4f6d);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)this_00,
             (size_type)in_RDI,in_stack_ffffffffffffff80);
  std::allocator<cnn::VariableIndex>::~allocator((allocator<cnn::VariableIndex> *)0x4e4f8d);
  iVar5 = 0;
  pEVar1 = std::initializer_list<cnn::expr::Expression>::begin(local_10);
  while( true ) {
    arguments = pEVar1;
    pEVar2 = std::initializer_list<cnn::expr::Expression>::end(in_stack_ffffffffffffff70);
    if (pEVar1 == pEVar2) break;
    in_stack_ffffffffffffff78 = (ComputationGraph *)&arguments->i;
    iVar3 = iVar5 + 1;
    this = std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::operator[]
                     (&local_30,(long)iVar5);
    VariableIndex::operator=(this,(VariableIndex *)in_stack_ffffffffffffff78);
    pEVar1 = arguments + 1;
    iVar5 = iVar3;
  }
  i_00 = local_18;
  ComputationGraph::
  add_function<cnn::AffineTransform,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>
            ((ComputationGraph *)CONCAT44(in_stack_ffffffffffffffbc,iVar5),
             (vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)arguments);
  Expression::Expression(pEVar1,in_stack_ffffffffffffff78,(VariableIndex *)i_00);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::~vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)pEVar1);
  EVar4._8_8_ = extraout_RDX;
  EVar4.pg = this_00;
  return EVar4;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }